

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseMaterialXValue(string *typeName,string *str,Value *value,string *err)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint8_t *binary;
  uint64_t length;
  string local_8e0 [32];
  string local_8c0 [32];
  ostringstream local_8a0 [8];
  ostringstream ss_e_1;
  undefined1 local_728 [8];
  float4 val_4;
  float3 val_3;
  float2 val_2;
  bool val_1;
  undefined1 local_6f8 [4];
  int val;
  AsciiParser parser;
  StreamReader sr;
  allocator local_1e9;
  string local_1e8 [32];
  fmt local_1c8 [32];
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  string *err_local;
  Value *value_local;
  string *str_local;
  string *typeName_local;
  
  bVar1 = is_supported_type(typeName);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseMaterialXValue");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x14e);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e8,"Invalid/unsupported type: {}",&local_1e9);
    fmt::format<std::__cxx11::string>
              (local_1c8,(string *)local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)typeName);
    poVar3 = ::std::operator<<((ostream *)local_1a8,(string *)local_1c8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)local_1c8);
    ::std::__cxx11::string::~string(local_1e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&sr.idx_);
      ::std::__cxx11::string::~string((string *)&sr.idx_);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    return false;
  }
  binary = (uint8_t *)::std::__cxx11::string::data();
  length = ::std::__cxx11::string::size();
  StreamReader::StreamReader((StreamReader *)&parser._primspec_fun._M_invoker,binary,length,false);
  ascii::AsciiParser::AsciiParser
            ((AsciiParser *)local_6f8,(StreamReader *)&parser._primspec_fun._M_invoker);
  iVar2 = ::std::__cxx11::string::compare((char *)typeName);
  if (iVar2 == 0) {
    bVar1 = ParseValue<int>((AsciiParser *)local_6f8,(int *)&stack0xfffffffffffff904,err);
    if (!bVar1) {
      val_2._M_elems[1] = 1.4013e-45;
      goto LAB_00403cfd;
    }
  }
  else {
    iVar2 = ::std::__cxx11::string::compare((char *)typeName);
    if (iVar2 == 0) {
      bVar1 = ParseValue<bool>((AsciiParser *)local_6f8,(bool *)((long)val_2._M_elems + 3),err);
      if (!bVar1) {
        val_2._M_elems[1] = 1.4013e-45;
        goto LAB_00403cfd;
      }
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((char *)typeName);
      if (iVar2 == 0) {
        bVar1 = ParseValue<std::array<float,2ul>>
                          ((AsciiParser *)local_6f8,(float2 *)(val_3._M_elems + 1),err);
        if (!bVar1) {
          val_2._M_elems[1] = 1.4013e-45;
          goto LAB_00403cfd;
        }
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)typeName);
        if (iVar2 == 0) {
          bVar1 = ParseValue<std::array<float,3ul>>
                            ((AsciiParser *)local_6f8,(float3 *)(val_4._M_elems + 2),err);
          if (!bVar1) {
            val_2._M_elems[1] = 1.4013e-45;
            goto LAB_00403cfd;
          }
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)typeName);
          if (iVar2 != 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_8a0);
            poVar3 = ::std::operator<<((ostream *)local_8a0,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseMaterialXValue");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x16f);
            ::std::operator<<(poVar3," ");
            ::std::operator+((char *)local_8c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x633683);
            poVar3 = ::std::operator<<((ostream *)local_8a0,local_8c0);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string(local_8c0);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_8e0);
              ::std::__cxx11::string::~string(local_8e0);
            }
            val_2._M_elems[1] = 1.4013e-45;
            ::std::__cxx11::ostringstream::~ostringstream(local_8a0);
            goto LAB_00403cfd;
          }
          bVar1 = ParseValue<std::array<float,4ul>>
                            ((AsciiParser *)local_6f8,(float4 *)local_728,err);
          if (!bVar1) {
            val_2._M_elems[1] = 1.4013e-45;
            goto LAB_00403cfd;
          }
        }
      }
    }
  }
  val_2._M_elems[1] = 1.4013e-45;
LAB_00403cfd:
  ascii::AsciiParser::~AsciiParser((AsciiParser *)local_6f8);
  return false;
}

Assistant:

bool ParseMaterialXValue(const std::string &typeName, const std::string &str,
                         value::Value *value, std::string *err) {
  (void)value;

  if (!is_supported_type(typeName)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Invalid/unsupported type: {}", typeName));
  }

  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  if (typeName.compare("integer") == 0) {
    int val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("boolean") == 0) {
    bool val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector2") == 0) {
    value::float2 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector3") == 0) {
    value::float3 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector4") == 0) {
    value::float4 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else {
    PUSH_ERROR_AND_RETURN("TODO: " + typeName);
  }

  // TODO
  return false;
}